

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O1

ExceptionOr<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::GetNullResults>_> *
__thiscall
kj::_::ExceptionOr<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::GetNullResults>_>::
operator=(ExceptionOr<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::GetNullResults>_>
          *this,ExceptionOr<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::GetNullResults>_>
                *param_1)

{
  ResponseHook *pRVar1;
  Disposer *pDVar2;
  SegmentReader *pSVar3;
  CapTableReader *pCVar4;
  void *pvVar5;
  WirePointer *pWVar6;
  NullableValue<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::GetNullResults>_>
  *pNVar7;
  NullableValue<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::GetNullResults>_>
  *pNVar8;
  StructPointerCount SVar9;
  undefined2 uVar10;
  int iVar11;
  undefined4 uVar12;
  
  ExceptionOrValue::operator=(&this->super_ExceptionOrValue,&param_1->super_ExceptionOrValue);
  if (param_1 != this) {
    if ((this->value).ptr.isSet == true) {
      (this->value).ptr.isSet = false;
      pRVar1 = (this->value).ptr.field_1.value.hook.ptr;
      if (pRVar1 != (ResponseHook *)0x0) {
        (this->value).ptr.field_1.value.hook.ptr = (ResponseHook *)0x0;
        pDVar2 = (this->value).ptr.field_1.value.hook.disposer;
        (**pDVar2->_vptr_Disposer)
                  (pDVar2,(_func_int *)
                          ((long)&pRVar1->_vptr_ResponseHook + (long)pRVar1->_vptr_ResponseHook[-2])
                  );
      }
    }
    if ((param_1->value).ptr.isSet == true) {
      pSVar3 = (param_1->value).ptr.field_1.value.super_Reader._reader.segment;
      pCVar4 = (param_1->value).ptr.field_1.value.super_Reader._reader.capTable;
      pvVar5 = (param_1->value).ptr.field_1.value.super_Reader._reader.data;
      pWVar6 = (param_1->value).ptr.field_1.value.super_Reader._reader.pointers;
      pNVar7 = &(param_1->value).ptr;
      SVar9 = *(StructPointerCount *)((long)&pNVar7->field_1 + 0x24);
      uVar10 = *(undefined2 *)((long)&pNVar7->field_1 + 0x26);
      pNVar8 = &(param_1->value).ptr;
      iVar11 = *(int *)((long)&pNVar8->field_1 + 0x28);
      uVar12 = *(undefined4 *)((long)&pNVar8->field_1 + 0x2c);
      pNVar8 = &(this->value).ptr;
      *(StructDataBitCount *)((long)&pNVar8->field_1 + 0x20) =
           *(StructDataBitCount *)((long)&pNVar7->field_1 + 0x20);
      *(StructPointerCount *)((long)&pNVar8->field_1 + 0x24) = SVar9;
      *(undefined2 *)((long)&pNVar8->field_1 + 0x26) = uVar10;
      pNVar7 = &(this->value).ptr;
      *(int *)((long)&pNVar7->field_1 + 0x28) = iVar11;
      *(undefined4 *)((long)&pNVar7->field_1 + 0x2c) = uVar12;
      (this->value).ptr.field_1.value.super_Reader._reader.data = pvVar5;
      (this->value).ptr.field_1.value.super_Reader._reader.pointers = pWVar6;
      (this->value).ptr.field_1.value.super_Reader._reader.segment = pSVar3;
      (this->value).ptr.field_1.value.super_Reader._reader.capTable = pCVar4;
      (this->value).ptr.field_1.value.hook.disposer =
           (param_1->value).ptr.field_1.value.hook.disposer;
      (this->value).ptr.field_1.value.hook.ptr = (param_1->value).ptr.field_1.value.hook.ptr;
      (param_1->value).ptr.field_1.value.hook.ptr = (ResponseHook *)0x0;
      (this->value).ptr.isSet = true;
    }
  }
  return this;
}

Assistant:

ExceptionOr& operator=(ExceptionOr&&) = default;